

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles3::Functional::eval_selection_vec3(ShaderEvalContext *c)

{
  float fVar1;
  float *pfVar2;
  VecAccess<float,_4,_3> local_50;
  undefined1 local_34 [12];
  undefined1 local_28 [12];
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  pfVar2 = tcu::Vector<float,_4>::z(c->in);
  fVar1 = *pfVar2;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_28,(int)local_10 + 0x40,1,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_34,(int)local_10 + 0x50,3,1);
  selection<tcu::Vector<float,3>>
            ((Functional *)&local_1c,0.0 < fVar1,(Vector<float,_3> *)local_28,
             (Vector<float,_3> *)local_34);
  tcu::Vector<float,_4>::xyz(&local_50,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_50,&local_1c);
  return;
}

Assistant:

void eval_selection_vec3	(ShaderEvalContext& c) { c.color.xyz()	= selection(c.in[0].z() > 0.0f,		c.in[1].swizzle(1, 2, 0),		c.in[2].swizzle(3, 1, 2)); }